

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerEncode.cpp
# Opt level: O0

bool DecodeSize(uchar *in,size_t cbIn,size_t *size,size_t *cbRead)

{
  uint uVar1;
  size_t maxSize;
  unsigned_long_long tmp;
  uint bytesToDecode;
  uint i;
  size_t *cbRead_local;
  size_t *size_local;
  size_t cbIn_local;
  uchar *in_local;
  
  *size = 0;
  *cbRead = 0;
  if (cbIn == 0) {
    in_local._7_1_ = false;
  }
  else if ((*in & 0x80) == 0) {
    *size = (ulong)*in;
    *cbRead = 1;
    in_local._7_1_ = true;
  }
  else {
    uVar1 = (uint)(*in & 0x7f);
    maxSize = 0;
    if (((uVar1 < 9) && (uVar1 + 1 <= cbIn)) && (uVar1 != 0)) {
      *cbRead = (ulong)(uVar1 + 1);
      for (tmp._4_4_ = 1; (ulong)tmp._4_4_ < *cbRead; tmp._4_4_ = tmp._4_4_ + 1) {
        maxSize = in[tmp._4_4_] + maxSize;
        if (tmp._4_4_ < uVar1) {
          maxSize = maxSize * 0x100;
        }
      }
      if (maxSize < 0x8000000000000000) {
        *size = maxSize;
        in_local._7_1_ = true;
      }
      else {
        in_local._7_1_ = false;
      }
    }
    else {
      in_local._7_1_ = false;
    }
  }
  return in_local._7_1_;
}

Assistant:

bool DecodeSize(const unsigned char* in, size_t cbIn, size_t& size, size_t& cbRead)
{
	unsigned int i = 0;

	size = 0;
	cbRead = 0;

	if (cbIn == 0)
	{
		return false;
	}

	// Detect short form
	if ((in[0] & 0x80) == 0)
	{
		size = in[0];
		cbRead = 1;
		return true;
	}

	unsigned int bytesToDecode = static_cast<unsigned char>(in[0] & (~0x80));
	unsigned long long tmp = 0;

	// Decode a maximum of 8 bytes, which adds up to a 56-bit number
	// That's MUCH bigger than anything we could possibly decode
	// And bytes to decode has to be at least one, or it isn't legal
    // Note - the case of 1 happens when you have a length between 128 and 255,
    // so the high bit is set, which precludes short form, resulting in a pattern of 0x81, 0x8b 
    // to encode the value of 139.
	if (bytesToDecode > 8 || bytesToDecode + 1 > cbIn || bytesToDecode == 0)
		return false;

	cbRead = bytesToDecode + 1;

	for (i = 1; i < cbRead; ++i)
	{
		tmp += in[i];

		if (i < bytesToDecode)
			tmp <<= 8;
	}

	// We now have the size in a 64-bit value, check whether it fits in a size_t
	// Arbitrarily say that max size is 1/2 SIZE_T_MAX
	size_t maxSize = (~(static_cast<size_t>(0))) >> 1;

	if (tmp > maxSize)
	{
		return false;
	}

	size = static_cast<size_t>(tmp);
	return true;
}